

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmuHelper.h
# Opt level: O0

UINT32 pow2_mask(UINT32 v)

{
  undefined4 local_c;
  UINT32 v_local;
  
  if (v == 0) {
    local_c = 0;
  }
  else {
    local_c = v - 1 >> 1 | v - 1;
    local_c = local_c >> 2 | local_c;
    local_c = local_c >> 4 | local_c;
    local_c = local_c >> 8 | local_c;
    local_c = local_c >> 0x10 | local_c;
  }
  return local_c;
}

Assistant:

INLINE UINT32 pow2_mask(UINT32 v)
{
	if (v == 0)
		return 0;
	v --;
	v |= (v >>  1);
	v |= (v >>  2);
	v |= (v >>  4);
	v |= (v >>  8);
	v |= (v >> 16);
	return v;
}